

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredMMDPDiscrete.cpp
# Opt level: O0

void __thiscall FactoredMMDPDiscrete::Initialize2DBNObservations(FactoredMMDPDiscrete *this)

{
  E *this_00;
  undefined8 uVar1;
  void *pvVar2;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_RDI;
  Index i;
  size_t nrAgents;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  TwoStageDynamicBayesianNetwork *in_stack_ffffffffffffffd0;
  uint local_20;
  char *in_stack_ffffffffffffffe8;
  Index oI;
  
  this_00 = (E *)(**(code **)(*(long *)&in_RDI->super_MultiAgentDecisionProcess + 0x10))();
  if (this_00 == (E *)0x0) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(this_00,in_stack_ffffffffffffffe8);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  for (local_20 = 0; (E *)(ulong)local_20 < this_00; local_20 = local_20 + 1) {
    MultiAgentDecisionProcessDiscreteFactoredStates::Get2DBN(in_RDI);
    uVar3 = local_20;
    pvVar2 = operator_new(8);
    oI = (Index)((ulong)pvVar2 >> 0x20);
    CPDKroneckerDelta::CPDKroneckerDelta
              ((CPDKroneckerDelta *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    TwoStageDynamicBayesianNetwork::SetCPD_O
              (in_stack_ffffffffffffffd0,oI,
               (CPDDiscreteInterface *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

void FactoredMMDPDiscrete::Initialize2DBNObservations() {
    size_t nrAgents = GetNrAgents();
    if(nrAgents == 0)
        throw(E("FactoredMMDPDiscrete::Initialize2DBNObservations() no agents specified"));
    
    for(Index i=0; i<nrAgents; i++) {
        // attach identity function to 2BDN (fully-observable scenario)
        Get2DBN()->SetCPD_O(i, new CPDKroneckerDelta());
    }
}